

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_0::AtomicCounterReferencedByCase::iterate
          (AtomicCounterReferencedByCase *this)

{
  uint uVar1;
  RenderContext *renderCtx;
  Program *programDefinition;
  bool bVar2;
  ContextType ctxType;
  int iVar3;
  deUint32 err;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *pcVar4;
  long lVar5;
  uint uVar6;
  GLint value;
  GLenum prop;
  GLint written;
  long local_300;
  Enum<int,_2UL> local_2f8;
  anon_struct_16_3_2a984f3a targetProps [6];
  undefined1 local_280 [8];
  ostream local_278;
  ShaderProgram program;
  
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar2 = glu::contextSupports(ctxType,(ApiType)0x23);
  targetProps[0].propName = 0x9306;
  targetProps[0].shaderType = SHADERTYPE_VERTEX;
  targetProps[0].extension = (char *)0x0;
  targetProps[1].propName = 0x930a;
  targetProps[1].shaderType = SHADERTYPE_FRAGMENT;
  targetProps[1].extension = (char *)0x0;
  targetProps[2].propName = 0x930b;
  targetProps[2].shaderType = SHADERTYPE_COMPUTE;
  targetProps[2].extension = (char *)0x0;
  targetProps[3].propName = 0x9307;
  targetProps[3].shaderType = SHADERTYPE_TESSELLATION_CONTROL;
  targetProps[3].extension = "GL_EXT_tessellation_shader";
  if (bVar2) {
    targetProps[3].extension = (char *)0x0;
  }
  targetProps[4].propName = 0x9308;
  targetProps[4].shaderType = SHADERTYPE_TESSELLATION_EVALUATION;
  targetProps[5].propName = 0x9309;
  targetProps[5].shaderType = SHADERTYPE_GEOMETRY;
  targetProps[5].extension = "GL_EXT_geometry_shader";
  if (bVar2) {
    targetProps[5].extension = (char *)0x0;
  }
  targetProps[4].extension = targetProps[3].extension;
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  local_300 = CONCAT44(extraout_var,iVar3);
  renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
  generateProgramInterfaceProgramSources((ProgramSources *)local_280,this->m_program);
  glu::ShaderProgram::ShaderProgram(&program,renderCtx,(ProgramSources *)local_280);
  glu::ProgramSources::~ProgramSources((ProgramSources *)local_280);
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  programDefinition = this->m_program;
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  checkAndLogProgram(&program,programDefinition,(Functions *)CONCAT44(extraout_var_00,iVar3),
                     ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
  lVar5 = 8;
  do {
    if (lVar5 == 0x68) {
      glu::ShaderProgram::~ShaderProgram(&program);
      return STOP;
    }
    pcVar4 = *(char **)((long)&targetProps[0].propName + lVar5);
    if (pcVar4 == (char *)0x0) {
LAB_012f59d6:
      prop = *(GLenum *)((long)targetProps + lVar5 + -8);
      uVar6 = *(uint *)((long)targetProps + lVar5 + -4);
      uVar1 = this->m_activeStagesMask;
      written = -1;
      local_280 = (undefined1  [8])
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_278);
      std::operator<<(&local_278,"Verifying ");
      pcVar4 = glu::getProgramResourcePropertyName(prop);
      std::operator<<(&local_278,pcVar4);
      std::operator<<(&local_278,", expecting ");
      uVar6 = (uint)((uVar1 >> (uVar6 & 0x1f) & 1) != 0);
      pcVar4 = glu::getBooleanName(uVar6);
      std::operator<<(&local_278,pcVar4);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_280,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_278);
      (**(code **)(local_300 + 0x9c8))(program.m_program.m_program,0x92c0,0,1,&prop,1,&written);
      err = (**(code **)(local_300 + 0x800))();
      glu::checkError(err,"query buffer binding",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramInterfaceQueryTests.cpp"
                      ,0xaf2);
      if (written == 1) {
        local_280 = (undefined1  [8])
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_278);
        pcVar4 = glu::getProgramResourcePropertyName(prop);
        std::operator<<(&local_278,pcVar4);
        std::operator<<(&local_278," = ");
        local_2f8.m_getName = glu::getBooleanName;
        local_2f8.m_value = -1;
        tcu::Format::Enum<int,_2UL>::toStream(&local_2f8,&local_278);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_280,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_278);
        if (uVar6 == 0xffffffff) goto LAB_012f5c28;
        local_280 = (undefined1  [8])
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_278);
        std::operator<<(&local_278,"Error, got unexpected value");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_280,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_278);
        pcVar4 = "unexpected property value";
      }
      else {
        local_280 = (undefined1  [8])
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_278);
        std::operator<<(&local_278,
                        "Error, query for referenced_by_* returned invalid number of values.");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_280,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_278);
        pcVar4 = "property query failed";
      }
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 pcVar4);
    }
    else {
      bVar2 = glu::ContextInfo::isExtensionSupported
                        (((this->super_TestCase).m_context)->m_contextInfo,pcVar4);
      if (bVar2) goto LAB_012f59d6;
    }
LAB_012f5c28:
    lVar5 = lVar5 + 0x10;
  } while( true );
}

Assistant:

AtomicCounterReferencedByCase::IterateResult AtomicCounterReferencedByCase::iterate (void)
{
	const bool supportsES32 = glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2));

	const struct
	{
		glw::GLenum		propName;
		glu::ShaderType	shaderType;
		const char*		extension;
	} targetProps[] =
	{
		{ GL_REFERENCED_BY_VERTEX_SHADER,			glu::SHADERTYPE_VERTEX,						DE_NULL												},
		{ GL_REFERENCED_BY_FRAGMENT_SHADER,			glu::SHADERTYPE_FRAGMENT,					DE_NULL												},
		{ GL_REFERENCED_BY_COMPUTE_SHADER,			glu::SHADERTYPE_COMPUTE,					DE_NULL												},
		{ GL_REFERENCED_BY_TESS_CONTROL_SHADER,		glu::SHADERTYPE_TESSELLATION_CONTROL,		(supportsES32 ? DE_NULL : "GL_EXT_tessellation_shader")	},
		{ GL_REFERENCED_BY_TESS_EVALUATION_SHADER,	glu::SHADERTYPE_TESSELLATION_EVALUATION,	(supportsES32 ? DE_NULL : "GL_EXT_tessellation_shader")	},
		{ GL_REFERENCED_BY_GEOMETRY_SHADER,			glu::SHADERTYPE_GEOMETRY,					(supportsES32 ? DE_NULL : "GL_EXT_geometry_shader")		},
	};

	const glw::Functions&		gl			= m_context.getRenderContext().getFunctions();
	const glu::ShaderProgram	program		(m_context.getRenderContext(), generateProgramInterfaceProgramSources(m_program));

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	checkAndLogProgram(program, m_program, m_context.getRenderContext().getFunctions(), m_testCtx.getLog());

	// check props
	for (int propNdx = 0; propNdx < DE_LENGTH_OF_ARRAY(targetProps); ++propNdx)
	{
		if (targetProps[propNdx].extension == DE_NULL || m_context.getContextInfo().isExtensionSupported(targetProps[propNdx].extension))
		{
			const glw::GLenum	prop		= targetProps[propNdx].propName;
			const glw::GLint	expected	= ((m_activeStagesMask & (1 << targetProps[propNdx].shaderType)) != 0) ? (GL_TRUE) : (GL_FALSE);
			glw::GLint			value		= -1;
			glw::GLint			written		= -1;

			m_testCtx.getLog() << tcu::TestLog::Message << "Verifying " << glu::getProgramResourcePropertyName(prop) << ", expecting " << glu::getBooleanName(expected) << tcu::TestLog::EndMessage;

			gl.getProgramResourceiv(program.getProgram(), GL_ATOMIC_COUNTER_BUFFER, 0, 1, &prop, 1, &written, &value);
			GLU_EXPECT_NO_ERROR(gl.getError(), "query buffer binding");

			if (written != 1)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Error, query for referenced_by_* returned invalid number of values." << tcu::TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "property query failed");
				continue;
			}

			m_testCtx.getLog() << tcu::TestLog::Message << glu::getProgramResourcePropertyName(prop) << " = " << glu::getBooleanStr(value) << tcu::TestLog::EndMessage;

			if (value != expected)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Error, got unexpected value" << tcu::TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "unexpected property value");
				continue;
			}
		}
	}

	return STOP;
}